

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::render
               (Functions *gl,deUint32 program,int targetWidth,int targetHeight,int x,int y,
               int width,int height)

{
  GLuint GVar1;
  GLenum GVar2;
  anon_unknown_0 local_58 [4];
  deUint32 posLocation;
  Vec2 positions [6];
  int y_local;
  int x_local;
  int targetHeight_local;
  int targetWidth_local;
  deUint32 program_local;
  Functions *gl_local;
  
  positions[5].m_data[1] = (float)y;
  toGLCoord(local_58,targetWidth,targetHeight,x,y);
  toGLCoord((anon_unknown_0 *)positions,targetWidth,targetHeight,x + width,
            (int)positions[5].m_data[1]);
  toGLCoord((anon_unknown_0 *)(positions + 1),targetWidth,targetHeight,x + width,
            (int)positions[5].m_data[1] + height);
  toGLCoord((anon_unknown_0 *)(positions + 2),targetWidth,targetHeight,x + width,
            (int)positions[5].m_data[1] + height);
  toGLCoord((anon_unknown_0 *)(positions + 3),targetWidth,targetHeight,x,
            (int)positions[5].m_data[1] + height);
  toGLCoord((anon_unknown_0 *)(positions + 4),targetWidth,targetHeight,x,(int)positions[5].m_data[1]
           );
  (*gl->useProgram)(program);
  GVar1 = (*gl->getAttribLocation)(program,"a_pos");
  (*gl->enableVertexAttribArray)(GVar1);
  (*gl->vertexAttribPointer)(GVar1,2,0x1406,'\0',0,local_58);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Failed to setup shader program for rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xf8);
  (*gl->viewport)(0,0,targetWidth,targetHeight);
  (*gl->drawArrays)(4,0,6);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Failed to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xfc);
  return;
}

Assistant:

void render (const glw::Functions& gl, deUint32 program, int targetWidth, int targetHeight, int x, int y, int width, int height)
{
	const tcu::Vec2 positions[] =
	{
		toGLCoord(targetWidth, targetHeight, x,			y),
		toGLCoord(targetWidth, targetHeight, x+width,	y),
		toGLCoord(targetWidth, targetHeight, x+width,	y+height),

		toGLCoord(targetWidth, targetHeight, x+width,	y+height),
		toGLCoord(targetWidth, targetHeight, x,			y+height),
		toGLCoord(targetWidth, targetHeight, x,			y)
	};

	deUint32 posLocation;

	gl.useProgram(program);
	posLocation	= gl.getAttribLocation(program, "a_pos");
	gl.enableVertexAttribArray(posLocation);
	gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup shader program for rendering");

	gl.viewport(0, 0, targetWidth, targetHeight);
	gl.drawArrays(GL_TRIANGLES, 0, 6);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");
}